

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O2

block_t * __thiscall
plot::detail::braille::block_t::over(block_t *__return_storage_ptr__,block_t *this,block_t *other)

{
  float *pfVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  block_t *pbVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Color CVar9;
  Color old_color;
  Color new_color;
  Color local_58;
  Color local_48;
  
  bVar2 = bitcount(~this->pixels & other->pixels);
  bVar3 = bitcount(~other->pixels & this->pixels);
  bVar4 = bitcount(this->pixels & other->pixels);
  fVar6 = (float)((uint)bVar3 + (uint)bVar2 + (uint)bVar4);
  pfVar1 = &(other->color).a;
  pbVar5 = this;
  if (*pfVar1 != 0.0) {
    pbVar5 = other;
  }
  if (NAN(*pfVar1)) {
    pbVar5 = other;
  }
  local_58.r = (pbVar5->color).r;
  local_58.g = (pbVar5->color).g;
  local_58.b = (pbVar5->color).b;
  local_58.a = (pbVar5->color).a;
  pfVar1 = &(this->color).a;
  pbVar5 = other;
  if (*pfVar1 != 0.0) {
    pbVar5 = this;
  }
  if (NAN(*pfVar1)) {
    pbVar5 = this;
  }
  local_48.r = (pbVar5->color).r;
  local_48.g = (pbVar5->color).g;
  local_48.b = (pbVar5->color).b;
  local_48.a = (pbVar5->color).a;
  CVar9 = Color::over(&local_48,&local_58);
  fVar7 = (float)bVar2 / fVar6;
  fVar8 = (float)bVar3 / fVar6;
  fVar6 = (float)bVar4 / fVar6;
  bVar2 = other->pixels;
  bVar3 = this->pixels;
  (__return_storage_ptr__->color).r = CVar9.r * fVar6 + local_48.r * fVar8 + local_58.r * fVar7;
  (__return_storage_ptr__->color).g = CVar9.g * fVar6 + local_48.g * fVar8 + local_58.g * fVar7;
  (__return_storage_ptr__->color).b = fVar6 * CVar9.b + local_48.b * fVar8 + local_58.b * fVar7;
  (__return_storage_ptr__->color).a = fVar6 * CVar9.a + local_48.a * fVar8 + local_58.a * fVar7;
  __return_storage_ptr__->pixels = bVar2 | bVar3;
  return __return_storage_ptr__;
}

Assistant:

block_t over(block_t const& other) const {
            auto old = bitcount(other.pixels & ~pixels);
            auto new_ = bitcount(pixels & ~other.pixels);

            std::uint8_t over_pixels = other.pixels & pixels;
            auto over_ = bitcount(over_pixels);

            float total = old + new_ + over_;

            auto old_color = (other.color.a != 0.0f) ? other.color : color;
            auto new_color = (color.a != 0.0f) ? color : other.color;
            auto over_color = new_color.over(old_color);

            auto mixed_color = (old/total)*old_color + (new_/total)*new_color + (over_/total)*over_color;

            return { mixed_color, std::uint8_t(pixels | other.pixels) };
        }